

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  bool bVar1;
  cmUVJobServerClient *this_00;
  int local_14;
  cmCTestMultiProcessHandler *pcStack_10;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  local_14 = test;
  pcStack_10 = this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->JobServerClient);
  if (bVar1) {
    this_00 = std::optional<cmUVJobServerClient>::operator->(&this->JobServerClient);
    cmUVJobServerClient::RequestToken(this_00);
    std::__cxx11::list<int,std::allocator<int>>::emplace_back<int&>
              ((list<int,std::allocator<int>> *)&this->JobServerQueuedTests,&local_14);
  }
  else {
    StartTestProcess(this,local_14);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartTest(int test)
{
  if (this->JobServerClient) {
    // There is a job server.  Request a token and queue the test to run
    // when a token is received.  Note that if we do not get a token right
    // away it's possible that the system load will be higher when the
    // token is received and we may violate the test-load limit.  However,
    // this is unlikely because if we do not get a token right away, some
    // other job that's currently running must finish before we get one.
    this->JobServerClient->RequestToken();
    this->JobServerQueuedTests.emplace_back(test);
  } else {
    // There is no job server.  Start the test now.
    this->StartTestProcess(test);
  }
}